

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_avcc.cpp
# Opt level: O1

int read_avcc(avcc_t *avcc,h264_stream_t *h,bs_t *b)

{
  uint32_t r;
  sps_t **ppsVar1;
  byte *pbVar2;
  uint8_t *puVar3;
  pps_t **pppVar4;
  uint8_t *puVar5;
  uint uVar6;
  uint32_t r_7;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  uint32_t r_5;
  long lVar12;
  long lVar13;
  uint32_t r_6;
  bool bVar14;
  
  uVar6 = b->bits_left;
  if ((uVar6 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
    uVar9 = (uint)*pbVar2;
    b->p = pbVar2 + 1;
  }
  else {
    pbVar2 = b->p;
    uVar9 = 0;
    iVar8 = 7;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      uVar7 = 0;
      if (pbVar2 < b->end) {
        uVar7 = (uint)((*pbVar2 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
      bVar14 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while (bVar14);
  }
  avcc->configurationVersion = uVar9;
  uVar6 = b->bits_left;
  if ((uVar6 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
    uVar9 = (uint)*pbVar2;
    b->p = pbVar2 + 1;
  }
  else {
    pbVar2 = b->p;
    uVar9 = 0;
    iVar8 = 7;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      uVar7 = 0;
      if (pbVar2 < b->end) {
        uVar7 = (uint)((*pbVar2 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
      bVar14 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while (bVar14);
  }
  avcc->AVCProfileIndication = uVar9;
  uVar6 = b->bits_left;
  if ((uVar6 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
    uVar9 = (uint)*pbVar2;
    b->p = pbVar2 + 1;
  }
  else {
    pbVar2 = b->p;
    uVar9 = 0;
    iVar8 = 7;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      uVar7 = 0;
      if (pbVar2 < b->end) {
        uVar7 = (uint)((*pbVar2 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
      bVar14 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while (bVar14);
  }
  avcc->profile_compatibility = uVar9;
  uVar6 = b->bits_left;
  if ((uVar6 == 8) && (pbVar2 = b->p, pbVar2 < b->end)) {
    uVar9 = (uint)*pbVar2;
    b->p = pbVar2 + 1;
  }
  else {
    pbVar2 = b->p;
    uVar9 = 0;
    iVar8 = 7;
    do {
      uVar6 = uVar6 - 1;
      b->bits_left = uVar6;
      uVar7 = 0;
      if (pbVar2 < b->end) {
        uVar7 = (uint)((*pbVar2 >> (uVar6 & 0x1f) & 1) != 0);
      }
      if (uVar6 == 0) {
        pbVar2 = pbVar2 + 1;
        b->p = pbVar2;
        b->bits_left = 8;
        uVar6 = 8;
      }
      uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
      bVar14 = iVar8 != 0;
      iVar8 = iVar8 + -1;
    } while (bVar14);
  }
  avcc->AVCLevelIndication = uVar9;
  puVar5 = b->p;
  pbVar2 = b->end;
  uVar6 = b->bits_left;
  iVar8 = 6;
  do {
    uVar6 = uVar6 - 1;
    if (uVar6 == 0) {
      puVar5 = puVar5 + 1;
      b->p = puVar5;
      uVar6 = 8;
    }
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  b->bits_left = uVar6;
  pbVar11 = b->p;
  uVar9 = 0;
  iVar8 = 1;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    uVar7 = 0;
    if (pbVar11 < pbVar2) {
      uVar7 = (uint)((*pbVar11 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
    bVar14 = iVar8 != 0;
    iVar8 = iVar8 + -1;
  } while (bVar14);
  avcc->lengthSizeMinusOne = uVar9;
  uVar6 = b->bits_left;
  puVar5 = b->p;
  iVar8 = 3;
  do {
    uVar6 = uVar6 - 1;
    if (uVar6 == 0) {
      puVar5 = puVar5 + 1;
      b->p = puVar5;
      uVar6 = 8;
    }
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  b->bits_left = uVar6;
  pbVar11 = b->p;
  uVar9 = 0;
  iVar8 = 4;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    uVar7 = 0;
    if (pbVar11 < pbVar2) {
      uVar7 = (uint)((*pbVar11 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
    bVar14 = iVar8 != 0;
    iVar8 = iVar8 + -1;
  } while (bVar14);
  avcc->numOfSequenceParameterSets = uVar9;
  ppsVar1 = (sps_t **)calloc((ulong)uVar9,8);
  avcc->sps_table = ppsVar1;
  if (0 < (int)uVar9) {
    lVar13 = 0;
    do {
      pbVar2 = b->p;
      pbVar11 = b->end;
      uVar6 = b->bits_left;
      iVar8 = 0xf;
      uVar9 = 0;
      do {
        uVar6 = uVar6 - 1;
        b->bits_left = uVar6;
        uVar7 = 0;
        if (pbVar2 < pbVar11) {
          uVar7 = (uint)((*pbVar2 >> (uVar6 & 0x1f) & 1) != 0);
        }
        if (uVar6 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar6 = 8;
        }
        uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
        bVar14 = iVar8 != 0;
        iVar8 = iVar8 + -1;
      } while (bVar14);
      puVar3 = (uint8_t *)malloc((ulong)uVar9);
      puVar5 = b->p;
      lVar12 = (long)pbVar11 - (long)puVar5;
      uVar6 = (uint)lVar12;
      if ((long)(ulong)uVar9 <= lVar12) {
        uVar6 = uVar9;
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      memcpy(puVar3,puVar5,(ulong)uVar6);
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      b->p = puVar5 + uVar9;
      iVar8 = read_nal_unit(h,puVar3,uVar6);
      free(puVar3);
      if ((-1 < iVar8) && (h->nal->nal_unit_type == 7)) {
        avcc->sps_table[lVar13] = h->sps;
      }
      lVar13 = lVar13 + 1;
      uVar9 = avcc->numOfSequenceParameterSets;
    } while (lVar13 < (int)uVar9);
  }
  pbVar2 = b->p;
  uVar6 = b->bits_left;
  uVar7 = 0;
  iVar8 = 7;
  do {
    uVar6 = uVar6 - 1;
    b->bits_left = uVar6;
    uVar10 = 0;
    if (pbVar2 < b->end) {
      uVar10 = (uint)((*pbVar2 >> (uVar6 & 0x1f) & 1) != 0);
    }
    if (uVar6 == 0) {
      pbVar2 = pbVar2 + 1;
      b->p = pbVar2;
      b->bits_left = 8;
      uVar6 = 8;
    }
    uVar7 = uVar7 | uVar10 << ((byte)iVar8 & 0x1f);
    bVar14 = iVar8 != 0;
    iVar8 = iVar8 + -1;
  } while (bVar14);
  avcc->numOfPictureParameterSets = uVar7;
  pppVar4 = (pps_t **)calloc((long)(int)uVar9,8);
  avcc->pps_table = pppVar4;
  if (0 < (int)uVar7) {
    lVar13 = 0;
    do {
      pbVar2 = b->p;
      pbVar11 = b->end;
      uVar6 = b->bits_left;
      iVar8 = 0xf;
      uVar9 = 0;
      do {
        uVar6 = uVar6 - 1;
        b->bits_left = uVar6;
        uVar7 = 0;
        if (pbVar2 < pbVar11) {
          uVar7 = (uint)((*pbVar2 >> (uVar6 & 0x1f) & 1) != 0);
        }
        if (uVar6 == 0) {
          pbVar2 = pbVar2 + 1;
          b->p = pbVar2;
          b->bits_left = 8;
          uVar6 = 8;
        }
        uVar9 = uVar9 | uVar7 << ((byte)iVar8 & 0x1f);
        bVar14 = iVar8 != 0;
        iVar8 = iVar8 + -1;
      } while (bVar14);
      puVar3 = (uint8_t *)malloc((ulong)uVar9);
      puVar5 = b->p;
      lVar12 = (long)pbVar11 - (long)puVar5;
      uVar6 = (uint)lVar12;
      if ((long)(ulong)uVar9 <= lVar12) {
        uVar6 = uVar9;
      }
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      memcpy(puVar3,puVar5,(ulong)uVar6);
      if ((int)uVar9 < 1) {
        uVar9 = 0;
      }
      b->p = puVar5 + uVar9;
      iVar8 = read_nal_unit(h,puVar3,uVar6);
      free(puVar3);
      if ((-1 < iVar8) && (h->nal->nal_unit_type == 8)) {
        avcc->pps_table[lVar13] = h->pps;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < avcc->numOfPictureParameterSets);
  }
  iVar8 = -1;
  if (b->p <= b->end) {
    iVar8 = (int)b->p - *(int *)&b->start;
  }
  return iVar8;
}

Assistant:

int read_avcc(avcc_t* avcc, h264_stream_t* h, bs_t* b)
{
    avcc->configurationVersion = bs_read_u8(b);
    avcc->AVCProfileIndication = bs_read_u8(b);
    avcc->profile_compatibility = bs_read_u8(b);
    avcc->AVCLevelIndication = bs_read_u8(b);
    /* int reserved = */ bs_read_u(b, 6); // '111111'b;
    avcc->lengthSizeMinusOne = bs_read_u(b, 2);
    /* int reserved = */ bs_read_u(b, 3); // '111'b;

    avcc->numOfSequenceParameterSets = bs_read_u(b, 5);
    avcc->sps_table = (sps_t**)calloc(avcc->numOfSequenceParameterSets, sizeof(sps_t*));
    for (int i = 0; i < avcc->numOfSequenceParameterSets; i++)
    {
        int sequenceParameterSetLength = bs_read_u(b, 16);
        int len = sequenceParameterSetLength;
        uint8_t* buf = (uint8_t*)malloc(len);
        len = bs_read_bytes(b, buf, len);
        int rc = read_nal_unit(h, buf, len);
        free(buf);
        if (h->nal->nal_unit_type != NAL_UNIT_TYPE_SPS) { continue; } // TODO report errors
        if (rc < 0) { continue; }
        avcc->sps_table[i] = h->sps; // TODO copy data?
    }

    avcc->numOfPictureParameterSets = bs_read_u(b, 8);
    avcc->pps_table = (pps_t**)calloc(avcc->numOfSequenceParameterSets, sizeof(pps_t*));
    for (int i = 0; i < avcc->numOfPictureParameterSets; i++)
    {
        int pictureParameterSetLength = bs_read_u(b, 16);
        int len = pictureParameterSetLength;
        uint8_t* buf = (uint8_t*)malloc(len);
        len = bs_read_bytes(b, buf, len);
        int rc = read_nal_unit(h, buf, len);
        free(buf);
        if (h->nal->nal_unit_type != NAL_UNIT_TYPE_PPS) { continue; } // TODO report errors
        if (rc < 0) { continue; }
        avcc->pps_table[i] = h->pps; // TODO copy data?
    }

    if (bs_overrun(b)) { return -1; }
    return bs_pos(b);
}